

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O3

double tpdf(double t,int df)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (0 < df) {
    dVar1 = (double)df;
    dVar2 = gamma_log((double)(df + 1) * 0.5);
    dVar3 = gamma_log(dVar1 * 0.5);
    dVar2 = exp(dVar2 - dVar3);
    dVar3 = pow((t * t) / dVar1 + 1.0,(double)(df + 1) * -0.5);
    dVar1 = dVar1 * 3.141592653589793;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    return (dVar3 * dVar2) / dVar1;
  }
  printf("Degree Of Freedom should be a positive real integer");
  exit(1);
}

Assistant:

double tpdf(double t, int df) {
	double ft,f1,f2,f3;
	double pi  = 3.1415926535897932384626434;
	
	if (df <= 0) {
		printf("Degree Of Freedom should be a positive real integer");
		exit(1);
	}
	
	f1 = gamma_log((double) (df+1.0)/2.0) - gamma_log((double) (df/2.0));
	f2 = exp(f1);
	f3 = pow(1.0 + (t*t / (df * 1.0)), - (df+1.0)/2.0);
	ft = f2 * f3 ;
	ft = ft / sqrt( (double) pi * df); 
	
	return ft;
	
}